

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.h
# Opt level: O0

void __thiscall
CVmSrcfEntry::CVmSrcfEntry(CVmSrcfEntry *this,int orig_index,int is_orig,size_t name_len)

{
  void *pvVar1;
  long in_RCX;
  byte in_DL;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  in_RDI[2] = 0;
  in_RDI[4] = 0;
  in_RDI[3] = 0;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(byte *)((long)in_RDI + 0xc) = *(byte *)((long)in_RDI + 0xc) & 0xfe | in_DL & 1;
  pvVar1 = malloc(in_RCX + 1);
  *in_RDI = pvVar1;
  return;
}

Assistant:

CVmSrcfEntry(int orig_index, int is_orig, size_t name_len)
    {
        /* no source lines yet */
        lines_ = 0;
        lines_cnt_ = lines_alo_ = 0;

        /* set the original index */
        orig_index_ = orig_index;

        /* remember whether this is the master entry */
        is_orig_ = is_orig;

        /* allocate space for our name buffer */
        name_buf_ = (char *)t3malloc(name_len + 1);
    }